

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.h
# Opt level: O2

void lock_spinlock(int *spinlock)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = -1;
  uVar2 = 1;
  while( true ) {
    LOCK();
    iVar1 = *spinlock;
    if (iVar1 == 0) {
      *spinlock = 1;
    }
    UNLOCK();
    if (iVar1 == 0) break;
    if ((int)(uVar2 / 10) * 10 + iVar3 == 0) {
      sleep(0);
    }
    iVar3 = iVar3 + -1;
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  return;
}

Assistant:

inline static void lock_spinlock(volatile int *spinlock)
{
	int count = 0;
	// Set the spin lock value to 1 if it is 0.
	while(!__sync_bool_compare_and_swap(spinlock, 0, 1))
	{
		count++;
		if (0 == count % 10)
		{
			// If it is already 1, let another thread play with the CPU for a
			// bit then try again.
			sleep(0);
		}
	}
}